

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::DecryptAes256(ByteData *__return_storage_ptr__,ByteData *key,ByteData *data)

{
  size_t sVar1;
  undefined8 uVar2;
  uchar *key_00;
  size_type key_len;
  uchar *bytes;
  size_type bytes_len;
  uchar *bytes_out;
  size_type len;
  string *in_stack_fffffffffffffe80;
  string *message;
  size_type in_stack_fffffffffffffe88;
  CfdError CVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  CfdException *in_stack_fffffffffffffe90;
  CfdException *this_00;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  int local_c4;
  undefined1 local_c0 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  undefined1 local_88 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  allocator local_59;
  string local_58 [32];
  CfdSourceLocation local_38;
  ByteData *local_20;
  ByteData *data_local;
  ByteData *key_local;
  
  local_20 = data;
  data_local = key;
  key_local = __return_storage_ptr__;
  sVar1 = ByteData::GetDataSize(key);
  if (sVar1 != 0x20) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    CVar3 = (CfdError)(in_stack_fffffffffffffe88 >> 0x20);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x27d;
    local_38.funcname = "DecryptAes256";
    logger::warn<>(&local_38,"wally_aes key size NG.");
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,"DecryptAes256Cbc key size error.",&local_59);
    CfdException::CfdException(in_stack_fffffffffffffe90,CVar3,in_stack_fffffffffffffe80);
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetDataSize(local_20);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3ee9d5);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88,(allocator_type *)in_stack_fffffffffffffe80);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3ee9fa);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &value_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,data_local);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0,local_20);
  message = (string *)
            &value_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  key_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3eea31);
  key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0;
  bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3eea5e);
  bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this);
  CVar3 = (CfdError)((ulong)this >> 0x20);
  this_00 = (CfdException *)local_88;
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3eea88);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  local_c4 = wally_aes(key_00,key_len,bytes,bytes_len,2,bytes_out,len);
  if (local_c4 != 0) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x28b;
    local_e0.funcname = "DecryptAes256";
    logger::warn<int&>(&local_e0,"wally_aes NG[{}].",&local_c4);
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_100,"DecryptAes256 error.",&local_101);
    CfdException::CfdException(this_00,CVar3,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::DecryptAes256(const ByteData &key, const ByteData &data) {
  if (key.GetDataSize() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(
        kCfdIllegalStateError, "DecryptAes256Cbc key size error.");
  }

  std::vector<uint8_t> output(data.GetDataSize());
  std::vector<uint8_t> key_data = key.GetBytes();
  std::vector<uint8_t> value_data = data.GetBytes();

  // Decrypt data using AES (ECB mode, no padding).
  int ret = wally_aes(
      key_data.data(), key_data.size(), value_data.data(), value_data.size(),
      AES_FLAG_DECRYPT, output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "DecryptAes256 error.");
  }

  return ByteData(output);
}